

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall
cmFindBaseDebugState::FoundAt(cmFindBaseDebugState *this,string *path,string *regexName)

{
  string local_80;
  DebugLibState local_60;
  string *local_20;
  string *regexName_local;
  string *path_local;
  cmFindBaseDebugState *this_local;
  
  if (((this->FindCommand->super_cmFindCommon).DebugMode & 1U) != 0) {
    local_20 = regexName;
    regexName_local = path;
    path_local = (string *)this;
    std::__cxx11::string::string((string *)&local_80,(string *)path);
    DebugLibState::DebugLibState(&local_60,regexName,&local_80);
    DebugLibState::operator=(&this->FoundSearchLocation,&local_60);
    DebugLibState::~DebugLibState(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void cmFindBaseDebugState::FoundAt(std::string const& path,
                                   std::string regexName)
{
  if (this->FindCommand->DebugMode) {
    this->FoundSearchLocation = DebugLibState{ std::move(regexName), path };
  }
}